

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O1

bool CheckTxScriptsSanity(CMutableTransaction *tx)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  CTransaction local_b0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&local_b0,tx);
  if ((long)local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    puVar1 = &((local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->prevout).n;
    puVar6 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start,puVar1);
    uVar2 = *puVar1;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b0.vin);
    if (((uint32_t *)puVar6 != puVar1) || (uVar2 != 0xffffffff)) goto LAB_00d513a9;
  }
  else {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b0.vin);
LAB_00d513a9:
    pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish != pCVar3;
    if (bVar9) {
      bVar5 = CScript::HasValidOps(&pCVar3->scriptSig);
      if (bVar5) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          if (0x272d < *(size_type *)
                        ((long)&(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar7].scriptSig.super_CScriptBase
                        + 0x1c)) break;
          pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) * 0x4ec4ec4ec4ec4ec5
          ;
          bVar5 = uVar7 - uVar8 == 0;
          bVar9 = uVar7 >= uVar8 && !bVar5;
          if (uVar7 < uVar8 || bVar5) goto LAB_00d51427;
          bVar5 = CScript::HasValidOps(&pCVar3[uVar8].scriptSig);
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar5);
      }
      if (bVar9) {
        bVar9 = false;
        goto LAB_00d5149e;
      }
    }
  }
LAB_00d51427:
  pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar9 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish == pCVar4;
  if ((!bVar9) && (bVar5 = CScript::HasValidOps(&pCVar4->scriptPubKey), bVar5)) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      if (0x272d < (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7].scriptPubKey.super_CScriptBase._size)
      break;
      pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) * -0x3333333333333333;
      bVar5 = uVar7 - uVar8 == 0;
      bVar9 = uVar7 < uVar8 || bVar5;
      if (uVar7 < uVar8 || bVar5) break;
      bVar5 = CScript::HasValidOps(&pCVar4[uVar8].scriptPubKey);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar5);
  }
LAB_00d5149e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

static bool CheckTxScriptsSanity(const CMutableTransaction& tx)
{
    // Check input scripts for non-coinbase txs
    if (!CTransaction(tx).IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!tx.vin[i].scriptSig.HasValidOps() || tx.vin[i].scriptSig.size() > MAX_SCRIPT_SIZE) {
                return false;
            }
        }
    }
    // Check output scripts
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        if (!tx.vout[i].scriptPubKey.HasValidOps() || tx.vout[i].scriptPubKey.size() > MAX_SCRIPT_SIZE) {
            return false;
        }
    }

    return true;
}